

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::
CompactRMatrixLimitedUncertainties
          (CompactRMatrixLimitedUncertainties *this,ParticlePairs *pairs,
          vector<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup>_>
          *groups)

{
  pointer pSVar1;
  
  ListRecord::ListRecord((ListRecord *)this,&pairs->super_ListRecord);
  pSVar1 = (groups->
           super__Vector_base<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (this->spin_groups_).
  super__Vector_base<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (groups->
       super__Vector_base<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->spin_groups_).
  super__Vector_base<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup>_>
  ._M_impl.super__Vector_impl_data._M_finish = pSVar1;
  (this->spin_groups_).
  super__Vector_base<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (groups->
       super__Vector_base<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (groups->
  super__Vector_base<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (groups->
  super__Vector_base<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (groups->
  super__Vector_base<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  verifySize((int)(((long)(this->spin_groups_).
                          super__Vector_base<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->spin_groups_).
                         super__Vector_base<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x90));
  return;
}

Assistant:

CompactRMatrixLimitedUncertainties( ParticlePairs&& pairs,
                                    std::vector< SpinGroup >&& groups ) :
    // no need for a try ... catch: nothing can go wrong here
    particle_pairs_( std::move( pairs ) ),
    spin_groups_( std::move( groups ) ) {

      verifySize( this->NJSX() );
    }